

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::DynamicMapField::SyncRepeatedFieldWithMapNoLock(DynamicMapField *this)

{
  MapKey *pMVar1;
  size_type field;
  bool bVar2;
  int iVar3;
  CppType CVar4;
  int32_t iVar5;
  uint32_t uVar6;
  Reflection *this_00;
  Descriptor *pDVar7;
  FieldDescriptor *this_01;
  RepeatedPtrField<google::protobuf::Message> *pRVar8;
  undefined4 extraout_var;
  string *psVar9;
  int64_t iVar10;
  uint64_t uVar11;
  LogMessage *other;
  const_pointer pvVar12;
  Message *pMVar13;
  Message *pMVar14;
  float value;
  double value_00;
  Message *message;
  MapValueConstRef *local_f8;
  MapValueRef *map_val;
  LogMessage local_e8;
  string local_a0;
  MapKey *local_80;
  MapKey *map_key;
  Message *new_entry;
  undefined1 local_58 [8];
  const_iterator it;
  FieldDescriptor *val_des;
  FieldDescriptor *key_des;
  Reflection *reflection;
  DynamicMapField *this_local;
  
  this_00 = Message::GetReflection(this->default_entry_);
  pDVar7 = Message::GetDescriptor(this->default_entry_);
  this_01 = Descriptor::map_key(pDVar7);
  pDVar7 = Message::GetDescriptor(this->default_entry_);
  it.it_.bucket_index_ = (size_type)Descriptor::map_value(pDVar7);
  if ((this->super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>)
      .super_MapFieldBase.repeated_field_ == (RepeatedPtrField<google::protobuf::Message> *)0x0) {
    pRVar8 = Arena::
             CreateMessageInternal<google::protobuf::RepeatedPtrField<google::protobuf::Message>>
                       ((this->
                        super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                        ).super_MapFieldBase.arena_);
    (this->super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>).
    super_MapFieldBase.repeated_field_ = pRVar8;
  }
  RepeatedPtrField<google::protobuf::Message>::Clear
            ((this->
             super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>)
             .super_MapFieldBase.repeated_field_);
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::begin
            ((const_iterator *)local_58,&this->map_);
  while( true ) {
    Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::end
              ((const_iterator *)&new_entry,&this->map_);
    bVar2 = protobuf::operator!=((const_iterator *)local_58,(const_iterator *)&new_entry);
    if (!bVar2) break;
    iVar3 = (*(this->default_entry_->super_MessageLite)._vptr_MessageLite[3])
                      (this->default_entry_,
                       (this->
                       super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                       ).super_MapFieldBase.arena_);
    map_key = (MapKey *)CONCAT44(extraout_var,iVar3);
    RepeatedPtrField<google::protobuf::Message>::AddAllocated
              ((this->
               super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
               ).super_MapFieldBase.repeated_field_,(Message *)map_key);
    local_80 = (MapKey *)
               Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::const_iterator::
               operator->((const_iterator *)local_58);
    CVar4 = FieldDescriptor::cpp_type(this_01);
    pMVar1 = map_key;
    switch(CVar4) {
    case CPPTYPE_INT32:
      iVar5 = MapKey::GetInt32Value(local_80);
      Reflection::SetInt32(this_00,(Message *)pMVar1,this_01,iVar5);
      break;
    case CPPTYPE_INT64:
      iVar10 = MapKey::GetInt64Value(local_80);
      Reflection::SetInt64(this_00,(Message *)pMVar1,this_01,iVar10);
      break;
    case CPPTYPE_UINT32:
      uVar6 = MapKey::GetUInt32Value(local_80);
      Reflection::SetUInt32(this_00,(Message *)pMVar1,this_01,uVar6);
      break;
    case CPPTYPE_UINT64:
      uVar11 = MapKey::GetUInt64Value(local_80);
      Reflection::SetUInt64(this_00,(Message *)pMVar1,this_01,uVar11);
      break;
    case CPPTYPE_DOUBLE:
    case CPPTYPE_FLOAT:
    case CPPTYPE_ENUM:
    case CPPTYPE_MESSAGE:
      LogMessage::LogMessage
                (&local_e8,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/map_field.cc"
                 ,0x1d8);
      other = LogMessage::operator<<(&local_e8,"Can\'t get here.");
      LogFinisher::operator=((LogFinisher *)((long)&map_val + 7),other);
      LogMessage::~LogMessage(&local_e8);
      break;
    case CPPTYPE_BOOL:
      bVar2 = MapKey::GetBoolValue(local_80);
      Reflection::SetBool(this_00,(Message *)pMVar1,this_01,bVar2);
      break;
    case CPPTYPE_STRING:
      psVar9 = MapKey::GetStringValue_abi_cxx11_(local_80);
      std::__cxx11::string::string((string *)&local_a0,(string *)psVar9);
      Reflection::SetString(this_00,(Message *)pMVar1,this_01,&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
    }
    pvVar12 = Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::const_iterator::
              operator->((const_iterator *)local_58);
    local_f8 = (MapValueConstRef *)(pvVar12 + 0x28);
    CVar4 = FieldDescriptor::cpp_type((FieldDescriptor *)it.it_.bucket_index_);
    field = it.it_.bucket_index_;
    pMVar1 = map_key;
    switch(CVar4) {
    case CPPTYPE_INT32:
      iVar5 = MapValueConstRef::GetInt32Value(local_f8);
      Reflection::SetInt32(this_00,(Message *)pMVar1,(FieldDescriptor *)field,iVar5);
      break;
    case CPPTYPE_INT64:
      iVar10 = MapValueConstRef::GetInt64Value(local_f8);
      Reflection::SetInt64(this_00,(Message *)pMVar1,(FieldDescriptor *)field,iVar10);
      break;
    case CPPTYPE_UINT32:
      uVar6 = MapValueConstRef::GetUInt32Value(local_f8);
      Reflection::SetUInt32(this_00,(Message *)pMVar1,(FieldDescriptor *)field,uVar6);
      break;
    case CPPTYPE_UINT64:
      uVar11 = MapValueConstRef::GetUInt64Value(local_f8);
      Reflection::SetUInt64(this_00,(Message *)pMVar1,(FieldDescriptor *)field,uVar11);
      break;
    case CPPTYPE_DOUBLE:
      value_00 = MapValueConstRef::GetDoubleValue(local_f8);
      Reflection::SetDouble(this_00,(Message *)pMVar1,(FieldDescriptor *)field,value_00);
      break;
    case CPPTYPE_FLOAT:
      value = MapValueConstRef::GetFloatValue(local_f8);
      Reflection::SetFloat(this_00,(Message *)pMVar1,(FieldDescriptor *)field,value);
      break;
    case CPPTYPE_BOOL:
      bVar2 = MapValueConstRef::GetBoolValue(local_f8);
      Reflection::SetBool(this_00,(Message *)pMVar1,(FieldDescriptor *)field,bVar2);
      break;
    case CPPTYPE_ENUM:
      iVar3 = MapValueConstRef::GetEnumValue(local_f8);
      Reflection::SetEnumValue(this_00,(Message *)pMVar1,(FieldDescriptor *)field,iVar3);
      break;
    case CPPTYPE_STRING:
      psVar9 = MapValueConstRef::GetStringValue_abi_cxx11_(local_f8);
      std::__cxx11::string::string((string *)&message,(string *)psVar9);
      Reflection::SetString(this_00,(Message *)pMVar1,(FieldDescriptor *)field,(string *)&message);
      std::__cxx11::string::~string((string *)&message);
      break;
    case CPPTYPE_MESSAGE:
      pMVar13 = MapValueConstRef::GetMessageValue(local_f8);
      pMVar14 = Reflection::MutableMessage
                          (this_00,(Message *)map_key,(FieldDescriptor *)it.it_.bucket_index_,
                           (MessageFactory *)0x0);
      (*(pMVar14->super_MessageLite)._vptr_MessageLite[0xd])(pMVar14,pMVar13);
    }
    Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::const_iterator::operator++
              ((const_iterator *)local_58);
  }
  return;
}

Assistant:

void DynamicMapField::SyncRepeatedFieldWithMapNoLock() const {
  const Reflection* reflection = default_entry_->GetReflection();
  const FieldDescriptor* key_des = default_entry_->GetDescriptor()->map_key();
  const FieldDescriptor* val_des = default_entry_->GetDescriptor()->map_value();
  if (MapFieldBase::repeated_field_ == nullptr) {
    MapFieldBase::repeated_field_ =
        Arena::CreateMessage<RepeatedPtrField<Message> >(MapFieldBase::arena_);
  }

  MapFieldBase::repeated_field_->Clear();

  for (Map<MapKey, MapValueRef>::const_iterator it = map_.begin();
       it != map_.end(); ++it) {
    Message* new_entry = default_entry_->New(MapFieldBase::arena_);
    MapFieldBase::repeated_field_->AddAllocated(new_entry);
    const MapKey& map_key = it->first;
    switch (key_des->cpp_type()) {
      case FieldDescriptor::CPPTYPE_STRING:
        reflection->SetString(new_entry, key_des, map_key.GetStringValue());
        break;
      case FieldDescriptor::CPPTYPE_INT64:
        reflection->SetInt64(new_entry, key_des, map_key.GetInt64Value());
        break;
      case FieldDescriptor::CPPTYPE_INT32:
        reflection->SetInt32(new_entry, key_des, map_key.GetInt32Value());
        break;
      case FieldDescriptor::CPPTYPE_UINT64:
        reflection->SetUInt64(new_entry, key_des, map_key.GetUInt64Value());
        break;
      case FieldDescriptor::CPPTYPE_UINT32:
        reflection->SetUInt32(new_entry, key_des, map_key.GetUInt32Value());
        break;
      case FieldDescriptor::CPPTYPE_BOOL:
        reflection->SetBool(new_entry, key_des, map_key.GetBoolValue());
        break;
      case FieldDescriptor::CPPTYPE_DOUBLE:
      case FieldDescriptor::CPPTYPE_FLOAT:
      case FieldDescriptor::CPPTYPE_ENUM:
      case FieldDescriptor::CPPTYPE_MESSAGE:
        GOOGLE_LOG(FATAL) << "Can't get here.";
        break;
    }
    const MapValueRef& map_val = it->second;
    switch (val_des->cpp_type()) {
      case FieldDescriptor::CPPTYPE_STRING:
        reflection->SetString(new_entry, val_des, map_val.GetStringValue());
        break;
      case FieldDescriptor::CPPTYPE_INT64:
        reflection->SetInt64(new_entry, val_des, map_val.GetInt64Value());
        break;
      case FieldDescriptor::CPPTYPE_INT32:
        reflection->SetInt32(new_entry, val_des, map_val.GetInt32Value());
        break;
      case FieldDescriptor::CPPTYPE_UINT64:
        reflection->SetUInt64(new_entry, val_des, map_val.GetUInt64Value());
        break;
      case FieldDescriptor::CPPTYPE_UINT32:
        reflection->SetUInt32(new_entry, val_des, map_val.GetUInt32Value());
        break;
      case FieldDescriptor::CPPTYPE_BOOL:
        reflection->SetBool(new_entry, val_des, map_val.GetBoolValue());
        break;
      case FieldDescriptor::CPPTYPE_DOUBLE:
        reflection->SetDouble(new_entry, val_des, map_val.GetDoubleValue());
        break;
      case FieldDescriptor::CPPTYPE_FLOAT:
        reflection->SetFloat(new_entry, val_des, map_val.GetFloatValue());
        break;
      case FieldDescriptor::CPPTYPE_ENUM:
        reflection->SetEnumValue(new_entry, val_des, map_val.GetEnumValue());
        break;
      case FieldDescriptor::CPPTYPE_MESSAGE: {
        const Message& message = map_val.GetMessageValue();
        reflection->MutableMessage(new_entry, val_des)->CopyFrom(message);
        break;
      }
    }
  }
}